

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O2

KeyIndexStorage * __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
::shrink(KeyIndexStorage *__return_storage_ptr__,
        KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
        *this,unsigned_long shrinkBatchSize,string *newIndexFileName)

{
  size_type __n;
  _Alloc_hider _Var1;
  size_type sVar2;
  ulong uVar3;
  KeyIndexStorage *updatedIndex;
  string batchFileName;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  tempFilesLock;
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
  notSortedKeys;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
  sortedBatches;
  string shrinkFilenamePrefix;
  string tempSortedIndexFilename;
  KeyIndexStorage actualExportedKeys;
  KeyIndexStorage exportedKeys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void,_supermap::Key<2UL>_>
  *local_2a0;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
  *local_298;
  unsigned_long local_290;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  local_288;
  string local_268;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
  local_248;
  string *local_228;
  anon_class_8_1_4c1cc3bf local_220;
  ulong local_218;
  undefined1 local_210 [16];
  long *local_200 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  __shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
  local_1c0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [168];
  KeyIndexStorage local_a8;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
  local_70;
  string local_50 [32];
  
  local_228 = newIndexFileName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"shrink",(allocator<char> *)local_150);
  std::operator+(&local_170,&local_1f0,"-sorted-keys");
  uVar3 = (((this->notSortedStorage_).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
            .register_.count_ + shrinkBatchSize) - 1) / shrinkBatchSize;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<2ul>>,unsigned_long,void>
  ::
  getCustomDataIterator<supermap::StorageValueIgnorer<supermap::Key<2ul>,supermap::ByteArray<2ul>>>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<2ul>>,unsigned_long,void>
              *)local_200);
  local_288.
  super__Vector_base<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.
  super__Vector_base<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = uVar3 + 1;
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
  ::reserve(&local_248,__n);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::reserve(&local_288,__n);
  exportKeys(&local_a8,this,shrinkBatchSize,&local_170);
  std::__shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2> *)local_150,
             &local_a8.
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
              .storageFile_.
              super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
  ::emplace_back<std::shared_ptr<supermap::io::TemporaryFile>>
            ((vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
              *)&local_288,(shared_ptr<supermap::io::TemporaryFile> *)local_150);
  local_218 = uVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>>>
  ::
  emplace_back<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>>
            ((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>>>
              *)&local_248,&local_a8);
  local_2a0 = &this->sortedStorage_;
  local_220.sortedStorageSize =
       (this->sortedStorage_).
       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
       .
       super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
       .
       super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
       .register_.count_;
  local_298 = &this->innerRegisterSupplier_;
  local_290 = 0;
  while( true ) {
    if (local_218 <= local_290) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   &local_1f0,"-batch-");
    std::__cxx11::to_string(&local_268,local_290);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   &local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)local_150);
    io::
    InputIterator<supermap::StorageValueIgnorer<supermap::Key<2ul>,supermap::ByteArray<2ul>>,unsigned_long,4ul,void>
    ::
    collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<2ul>,supermap::ByteArray<2ul>>&&,unsigned_long)_1_,supermap::KeyValue<supermap::Key<2ul>,unsigned_long>>
              ((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                *)&local_268,local_200,local_220,shrinkBatchSize);
    sVar2 = local_268._M_string_length;
    _Var1._M_p = local_268._M_dataplus._M_p;
    std::__cxx11::string::string(local_50,(string *)&local_2c0);
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
    ::getFileManager(&local_1c0);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
    ::function(&local_70,local_298);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>
    ::
    SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>>>>,supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&)_1_,supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&)_2_>
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>
                *)local_150,_Var1._M_p,sVar2,0,local_50,&local_1c0,&local_70);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_1c0.
                super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                .
                super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                .register_);
    std::__cxx11::string::~string(local_50);
    std::__shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d0,
               (__shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2> *)
               (local_150 + 0x20));
    std::
    vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
    ::emplace_back<std::shared_ptr<supermap::io::TemporaryFile>>
              ((vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
                *)&local_288,(shared_ptr<supermap::io::TemporaryFile> *)&local_1d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
    std::
    vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>>>
    ::
    emplace_back<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>>
              ((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>>>
                *)&local_248,
               (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
                *)local_150);
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
    ::~SingleFileIndexedStorage
              ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                *)local_150);
    std::
    _Vector_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
    ::~_Vector_base((_Vector_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                     *)&local_268);
    std::__cxx11::string::~string((string *)&local_2c0);
    local_290 = local_290 + 1;
  }
  std::__cxx11::string::string((string *)&local_190,(string *)local_228);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
  ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                    *)local_210);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
              *)&local_1c0.
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                 .register_.count_,local_298);
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
  ::SortedSingleFileIndexedStorage
            (__return_storage_ptr__,&local_248,&local_190,
             (shared_ptr<supermap::io::FileManager> *)local_210,shrinkBatchSize,
             (InnerRegisterSupplier *)
             &local_1c0.
              super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
              .register_.count_);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &local_1c0.
              super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
              .register_.count_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  std::__cxx11::string::~string((string *)&local_190);
  std::operator+(&local_2c0,&local_1f0,"-new-not-sorted");
  std::operator+(&local_268,&local_1f0,"-new-sorted");
  KeyValueShrinkableStorage
            ((KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
              *)local_150,this,__return_storage_ptr__,&local_2c0,&local_268,shrinkBatchSize);
  resetWith(this,(KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                  *)local_150);
  ~KeyValueShrinkableStorage
            ((KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
              *)local_150);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::operator+(&local_2c0,&local_1f0,"-actual-index");
  exportKeys((KeyIndexStorage *)local_150,this,shrinkBatchSize,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2> *)&local_2c0,
             (__shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2> *)
             (local_150 + 0x20));
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
  ::emplace_back<std::shared_ptr<supermap::io::TemporaryFile>>
            ((vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
              *)&local_288,(shared_ptr<supermap::io::TemporaryFile> *)&local_2c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c0._M_string_length);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  ::resetWith(&__return_storage_ptr__->
               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
              ,(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                *)local_150);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  ::~SingleFileIndexedStorage
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
              *)local_150);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  ::~SingleFileIndexedStorage
            (&local_a8.
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
            );
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
  ::~vector(&local_248);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::~vector(&local_288);
  if (local_200[0] != (long *)0x0) {
    (**(code **)(*local_200[0] + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1f0);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] KeyIndexStorage shrink(IndexT shrinkBatchSize, const std::string &newIndexFileName) {

        const std::string shrinkFilenamePrefix = "shrink";
        const std::string tempSortedIndexFilename = shrinkFilenamePrefix + "-sorted-keys";

        std::size_t batchesCount = (notSortedStorage_.getItemsCount() + shrinkBatchSize - 1) / shrinkBatchSize;
        auto notSortedKeysStream = getNotSortedKeys();
        std::vector<std::shared_ptr<io::TemporaryFile>> tempFilesLock;
        std::vector<KeyIndexStorage> sortedBatches;
        sortedBatches.reserve(batchesCount + 1);
        tempFilesLock.reserve(batchesCount + 1);

        KeyIndexStorage exportedKeys = exportKeys(shrinkBatchSize, tempSortedIndexFilename);
        tempFilesLock.push_back(exportedKeys.shareStorageFile());

        sortedBatches.push_back(std::move(exportedKeys));
        IndexT sortedStorageSize = sortedStorage_.getItemsCount();
        for (std::size_t batchI = 0; batchI < batchesCount; ++batchI) {
            const std::string batchFileName = shrinkFilenamePrefix + "-batch-" + std::to_string(batchI);
            std::vector<KeyIndex> notSortedKeys = notSortedKeysStream.collectWith(
                [sortedStorageSize](ValueIgnorer &&svi, IndexT index) {
                    return KeyIndex{std::move(svi.key), index + sortedStorageSize};
                },
                shrinkBatchSize
            );
            KeyIndexStorage sortedBatch(
                notSortedKeys.begin(),
                notSortedKeys.end(),
                false,
                batchFileName,
                getFileManager(),
                [](const KeyIndex &a, const KeyIndex &b) { return a.key < b.key; },
                [](const KeyIndex &a, const KeyIndex &b) { return a.key == b.key; },
                innerRegisterSupplier_
            );
            tempFilesLock.push_back(sortedBatch.shareStorageFile());
            assert(sortedBatch.getItemsCount() > 0 && "Batch file can not be empty");
            sortedBatches.push_back(std::move(sortedBatch));
        }

        KeyIndexStorage updatedIndex(
            sortedBatches,
            newIndexFileName,
            getFileManager(),
            shrinkBatchSize,
            innerRegisterSupplier_
        );

        resetWith(KeyValueShrinkableStorage(
            *this,
            updatedIndex,
            shrinkFilenamePrefix + "-new-not-sorted",
            shrinkFilenamePrefix + "-new-sorted",
            shrinkBatchSize
        ));

        KeyIndexStorage actualExportedKeys
            = exportKeys(shrinkBatchSize, shrinkFilenamePrefix + "-actual-index");
        tempFilesLock.push_back(actualExportedKeys.shareStorageFile());
        updatedIndex.resetWith(std::move(actualExportedKeys));
        return updatedIndex;
    }